

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LameWrapper.cpp
# Opt level: O2

bool __thiscall
cinemo::LameWrapper::encodeStereo_IEEE_64(LameWrapper *this,string *in,string *out,lame_t *lame)

{
  char cVar1;
  bool bVar2;
  ifstream wav;
  long local_7c38;
  ofstream mp3;
  uchar mp3_buff [10240];
  short wav_buff_r [5120];
  short wav_buff_l [5120];
  
  std::ifstream::ifstream(&wav,(string *)in,_S_in|_S_bin);
  std::ofstream::ofstream(&mp3,(string *)out,_S_trunc|_S_out|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::istream::ignore((long)&wav);
      do {
        std::istream::read((char *)&wav,(long)wav_buff_l);
        std::istream::read((char *)&wav,(long)wav_buff_r);
        if (local_7c38 == 0) {
          lame_encode_flush(*lame,mp3_buff,0x2800);
        }
        else {
          lame_encode_buffer_ieee_double
                    (*lame,wav_buff_l,wav_buff_r,local_7c38 / 8 & 0xffffffff,mp3_buff,0x2800);
        }
        std::ostream::write((char *)&mp3,(long)mp3_buff);
      } while (local_7c38 != 0);
      std::ifstream::close();
      std::ofstream::close();
      bVar2 = true;
      goto LAB_001059de;
    }
  }
  std::__cxx11::string::append((char *)&this->message_buffer);
  bVar2 = false;
LAB_001059de:
  std::ofstream::~ofstream(&mp3);
  std::ifstream::~ifstream(&wav);
  return bVar2;
}

Assistant:

bool LameWrapper::encodeStereo_IEEE_64(const string& in, const string& out,
		const lame_t& lame) {
		std::ifstream wav(in, std::ios_base::in | std::ios_base::binary);
		std::ofstream mp3(out, std::ios_base::out | std::ios_base::trunc |
			std::ios_base::binary);

		//just to make sure...
		if (!wav.is_open() || !mp3.is_open()) {
			message_buffer.append("Error in reading / writing source and destination files.");
			return false;
		}

		std::streamsize read, write;

		//short int wav_buff[WAV_BUFF_SIZE]; //all channels
		short int wav_buff_l[WAV_BUFF_SIZE / 2]; //left channel
		short int wav_buff_r[WAV_BUFF_SIZE / 2]; //right channel
		unsigned char mp3_buff[MP3_BUFF_SIZE];

		wav.ignore(wh->DataBegin); //skip to data

		do {
			wav.read(reinterpret_cast<char*>(&wav_buff_l), sizeof(short int) * 4);
			wav.read(reinterpret_cast<char*>(&wav_buff_r), sizeof(short int) * 4);
			read = wav.gcount();

			if (read == 0) { //reading from wav file has ended!
				write = lame_encode_flush(lame,
					reinterpret_cast<unsigned char*>(&mp3_buff),
					MP3_BUFF_SIZE);
			}
			else { //encoding
				write = lame_encode_buffer_ieee_double(lame,
					reinterpret_cast<double*>(&wav_buff_l[0]),
					reinterpret_cast<double*>(&wav_buff_r[0]),
					read / 8,
					mp3_buff,
					MP3_BUFF_SIZE);

			}
			mp3.write(reinterpret_cast<char*>(&mp3_buff), write);
		} while (read != 0);

		wav.close();
		mp3.close();

		return true;
	}